

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool rest_mempool(any *context,HTTPRequest *req,string *str_uri_part)

{
  string_view reply;
  bool bVar1;
  undefined1 uVar2;
  RESTResponseFormat RVar3;
  CTxMemPool *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  bool mempool_sequence;
  bool verbose;
  runtime_error *e_1;
  runtime_error *e;
  CTxMemPool *mempool;
  RESTResponseFormat rf;
  string raw_mempool_sequence;
  string raw_verbose;
  string str_json;
  string param;
  UniValue *in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffac0;
  undefined6 in_stack_fffffffffffffac8;
  undefined1 in_stack_ffffffffffffface;
  undefined1 in_stack_fffffffffffffacf;
  string *in_stack_fffffffffffffad0;
  int nStatus;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  HTTPRequest *in_stack_fffffffffffffaf0;
  any *in_stack_fffffffffffffaf8;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  string *message;
  undefined4 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1c;
  undefined1 in_stack_fffffffffffffb1d;
  undefined1 in_stack_fffffffffffffb1e;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffb1f;
  HTTPRequest *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *req_00;
  string *in_stack_fffffffffffffb28;
  undefined5 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb35;
  undefined1 in_stack_fffffffffffffb36;
  undefined1 in_stack_fffffffffffffb37;
  undefined1 in_stack_fffffffffffffb86;
  undefined1 in_stack_fffffffffffffb87;
  CTxMemPool *in_stack_fffffffffffffb88;
  CTxMemPool *in_stack_fffffffffffffb90;
  byte local_3b4;
  allocator<char> local_3b3;
  allocator<char> local_3b2;
  allocator<char> local_3b1;
  undefined1 local_3b0 [3];
  allocator<char> local_3ad;
  allocator<char> local_3ac [2];
  allocator<char> local_3aa;
  allocator<char> local_3a9 [97];
  undefined1 local_348 [88];
  UniValue local_2f0;
  UniValue local_258 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup(in_stack_fffffffffffffaf0);
  if (!bVar1) {
    local_3b4 = 0;
    goto LAB_0125b665;
  }
  std::__cxx11::string::string(in_stack_fffffffffffffad0);
  RVar3 = ParseDataFormat((string *)
                          CONCAT17(in_stack_fffffffffffffb37,
                                   CONCAT16(in_stack_fffffffffffffb36,
                                            CONCAT15(in_stack_fffffffffffffb35,
                                                     in_stack_fffffffffffffb30))),
                          in_stack_fffffffffffffb28);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffacf,
                                   CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)),
                          in_stack_fffffffffffffac0);
  if ((((bVar1 ^ 0xffU) & 1) == 0) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffacf,
                                       CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)
                                      ),in_stack_fffffffffffffac0), ((bVar1 ^ 0xffU) & 1) == 0)) {
    pCVar4 = GetMemPool(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    if (pCVar4 == (CTxMemPool *)0x0) {
      local_3b4 = 0;
    }
    else if (RVar3 == JSON) {
      std::__cxx11::string::string(in_stack_fffffffffffffad0);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffacf,
                                       CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)
                                      ),in_stack_fffffffffffffac0);
      if (bVar1) {
        std::__cxx11::string::string(in_stack_fffffffffffffad0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb08,
                   (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                   (allocator<char> *)in_stack_fffffffffffffaf8);
        HTTPRequest::GetQueryParameter
                  ((HTTPRequest *)in_stack_fffffffffffffad0,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffacf,
                            CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)));
        std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffaf8,(char (*) [5])in_stack_fffffffffffffaf0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb1f,
                            CONCAT16(in_stack_fffffffffffffb1e,
                                     CONCAT15(in_stack_fffffffffffffb1d,
                                              CONCAT14(in_stack_fffffffffffffb1c,
                                                       in_stack_fffffffffffffb18)))),
                   in_stack_fffffffffffffb10);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffab8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        std::allocator<char>::~allocator(&local_3aa);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffacf,
                                          CONCAT16(in_stack_ffffffffffffface,
                                                   in_stack_fffffffffffffac8)),
                                in_stack_fffffffffffffac0);
        if ((((bVar1 ^ 0xffU) & 1) == 0) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffacf,
                                                CONCAT16(in_stack_ffffffffffffface,
                                                         in_stack_fffffffffffffac8)),
                                    in_stack_fffffffffffffac0), ((bVar1 ^ 0xffU) & 1) == 0)) {
          std::__cxx11::string::string(in_stack_fffffffffffffad0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb08,
                     (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                     (allocator<char> *)in_stack_fffffffffffffaf8);
          HTTPRequest::GetQueryParameter
                    ((HTTPRequest *)in_stack_fffffffffffffad0,
                     (string *)
                     CONCAT17(in_stack_fffffffffffffacf,
                              CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)));
          std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffaf8,(char (*) [6])in_stack_fffffffffffffaf0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb1f,
                              CONCAT16(in_stack_fffffffffffffb1e,
                                       CONCAT15(in_stack_fffffffffffffb1d,
                                                CONCAT14(in_stack_fffffffffffffb1c,
                                                         in_stack_fffffffffffffb18)))),
                     in_stack_fffffffffffffb10);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab8);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffab8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab8);
          std::allocator<char>::~allocator(&local_3ad);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffacf,
                                              CONCAT16(in_stack_ffffffffffffface,
                                                       in_stack_fffffffffffffac8)),
                                  in_stack_fffffffffffffac0);
          if ((((bVar1 ^ 0xffU) & 1) == 0) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffacf,
                                                  CONCAT16(in_stack_ffffffffffffface,
                                                           in_stack_fffffffffffffac8)),
                                      in_stack_fffffffffffffac0), ((bVar1 ^ 0xffU) & 1) == 0)) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffacf,
                                                CONCAT16(in_stack_ffffffffffffface,
                                                         in_stack_fffffffffffffac8)),
                                    in_stack_fffffffffffffac0);
            uVar5 = bVar1;
            uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffacf,
                                                CONCAT16(in_stack_ffffffffffffface,
                                                         in_stack_fffffffffffffac8)),
                                    in_stack_fffffffffffffac0);
            if ((bVar1) && ((bool)uVar2)) {
              message = (string *)local_3b0;
              in_stack_fffffffffffffb08 = in_RSI;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb08,
                         (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                         (allocator<char> *)in_stack_fffffffffffffaf8);
              local_3b4 = RESTERR(in_stack_fffffffffffffb20,
                                  CONCAT13(in_stack_fffffffffffffb1f,
                                           CONCAT12(uVar5,CONCAT11(uVar2,in_stack_fffffffffffffb1c))
                                          ),message);
              in_stack_fffffffffffffb07 = local_3b4;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffab8);
              std::allocator<char>::~allocator((allocator<char> *)local_3b0);
              bVar1 = true;
            }
            else {
              MempoolToJSON(in_stack_fffffffffffffb88,(bool)in_stack_fffffffffffffb87,
                            (bool)in_stack_fffffffffffffb86);
              UniValue::write_abi_cxx11_(local_258,(int)&local_2f0 + 0x40,(void *)0x0,0);
              std::operator+(in_stack_fffffffffffffad0,
                             (char *)CONCAT17(in_stack_fffffffffffffacf,
                                              CONCAT16(in_stack_ffffffffffffface,
                                                       in_stack_fffffffffffffac8)));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffb1f,
                                 CONCAT16(uVar5,CONCAT15(uVar2,CONCAT14(in_stack_fffffffffffffb1c,
                                                                        in_stack_fffffffffffffb18)))
                                ),in_stack_fffffffffffffb10);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffab8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffab8);
              UniValue::~UniValue(in_stack_fffffffffffffab8);
              bVar1 = false;
            }
          }
          else {
            req_00 = in_RSI;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffb08,
                       (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                       (allocator<char> *)in_stack_fffffffffffffaf8);
            local_3b4 = RESTERR((HTTPRequest *)req_00,
                                CONCAT13(in_stack_fffffffffffffb1f,
                                         CONCAT12(in_stack_fffffffffffffb1e,
                                                  CONCAT11(in_stack_fffffffffffffb1d,
                                                           in_stack_fffffffffffffb1c))),
                                in_stack_fffffffffffffb10);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffab8);
            std::allocator<char>::~allocator((allocator<char> *)(local_3b0 + 1));
            bVar1 = true;
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb08,
                     (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                     (allocator<char> *)in_stack_fffffffffffffaf8);
          local_3b4 = RESTERR(in_stack_fffffffffffffb20,
                              CONCAT13(in_stack_fffffffffffffb1f,
                                       CONCAT12(in_stack_fffffffffffffb1e,
                                                CONCAT11(in_stack_fffffffffffffb1d,
                                                         in_stack_fffffffffffffb1c))),
                              in_stack_fffffffffffffb10);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab8);
          std::allocator<char>::~allocator(local_3ac);
          bVar1 = true;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        if (!bVar1) goto LAB_0125b3ae;
      }
      else {
        MempoolInfoToJSON(in_stack_fffffffffffffb90);
        UniValue::write_abi_cxx11_(&local_2f0,(int)local_348,(void *)0x0,0);
        std::operator+(in_stack_fffffffffffffad0,
                       (char *)CONCAT17(in_stack_fffffffffffffacf,
                                        CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8
                                                )));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb1f,
                            CONCAT16(in_stack_fffffffffffffb1e,
                                     CONCAT15(in_stack_fffffffffffffb1d,
                                              CONCAT14(in_stack_fffffffffffffb1c,
                                                       in_stack_fffffffffffffb18)))),
                   in_stack_fffffffffffffb10);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        UniValue::~UniValue(in_stack_fffffffffffffab8);
LAB_0125b3ae:
        __a = &local_3b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb08,
                   (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb08,
                   (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),__a);
        HTTPRequest::WriteHeader
                  ((HTTPRequest *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffacf,
                            CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)));
        nStatus = (int)((ulong)in_stack_fffffffffffffad0 >> 0x20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        std::allocator<char>::~allocator(&local_3b2);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab8);
        std::allocator<char>::~allocator(&local_3b1);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffad8);
        reply._M_str = (char *)__a;
        reply._M_len = (size_t)in_RSI;
        HTTPRequest::WriteReply((HTTPRequest *)in_stack_fffffffffffffad8,nStatus,reply);
        local_3b4 = 1;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb08,
                 (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                 (allocator<char> *)in_stack_fffffffffffffaf8);
      local_3b4 = RESTERR(in_stack_fffffffffffffb20,
                          CONCAT13(in_stack_fffffffffffffb1f,
                                   CONCAT12(in_stack_fffffffffffffb1e,
                                            CONCAT11(in_stack_fffffffffffffb1d,
                                                     in_stack_fffffffffffffb1c))),
                          in_stack_fffffffffffffb10);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab8);
      std::allocator<char>::~allocator(&local_3b3);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               (allocator<char> *)in_stack_fffffffffffffaf8);
    local_3b4 = RESTERR(in_stack_fffffffffffffb20,
                        CONCAT13(in_stack_fffffffffffffb1f,
                                 CONCAT12(in_stack_fffffffffffffb1e,
                                          CONCAT11(in_stack_fffffffffffffb1d,
                                                   in_stack_fffffffffffffb1c))),
                        in_stack_fffffffffffffb10);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab8);
    std::allocator<char>::~allocator(local_3a9);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8);
LAB_0125b665:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_3b4 & 1);
}

Assistant:

static bool rest_mempool(const std::any& context, HTTPRequest* req, const std::string& str_uri_part)
{
    if (!CheckWarmup(req))
        return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, str_uri_part);
    if (param != "contents" && param != "info") {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/mempool/<info|contents>.json");
    }

    const CTxMemPool* mempool = GetMemPool(context, req);
    if (!mempool) return false;

    switch (rf) {
    case RESTResponseFormat::JSON: {
        std::string str_json;
        if (param == "contents") {
            std::string raw_verbose;
            try {
                raw_verbose = req->GetQueryParameter("verbose").value_or("true");
            } catch (const std::runtime_error& e) {
                return RESTERR(req, HTTP_BAD_REQUEST, e.what());
            }
            if (raw_verbose != "true" && raw_verbose != "false") {
                return RESTERR(req, HTTP_BAD_REQUEST, "The \"verbose\" query parameter must be either \"true\" or \"false\".");
            }
            std::string raw_mempool_sequence;
            try {
                raw_mempool_sequence = req->GetQueryParameter("mempool_sequence").value_or("false");
            } catch (const std::runtime_error& e) {
                return RESTERR(req, HTTP_BAD_REQUEST, e.what());
            }
            if (raw_mempool_sequence != "true" && raw_mempool_sequence != "false") {
                return RESTERR(req, HTTP_BAD_REQUEST, "The \"mempool_sequence\" query parameter must be either \"true\" or \"false\".");
            }
            const bool verbose{raw_verbose == "true"};
            const bool mempool_sequence{raw_mempool_sequence == "true"};
            if (verbose && mempool_sequence) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Verbose results cannot contain mempool sequence values. (hint: set \"verbose=false\")");
            }
            str_json = MempoolToJSON(*mempool, verbose, mempool_sequence).write() + "\n";
        } else {
            str_json = MempoolInfoToJSON(*mempool).write() + "\n";
        }

        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, str_json);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: json)");
    }
    }
}